

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGlobalGenerator *this_00;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string compilerId;
  string hostSystemName;
  string systemName;
  string compilerIdVar;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CXX_COMPILER_ID","");
  this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CXX","");
  bVar3 = cmGlobalGenerator::GetLanguageEnabled(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)local_50._M_string_length,0x4b754a);
  }
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_SYSTEM_NAME","");
  pcVar5 = cmMakefile::GetSafeDefinition(mf,&local_70);
  std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_SYSTEM_NAME","");
  pcVar5 = cmMakefile::GetSafeDefinition(mf,&local_b0);
  std::__cxx11::string::string((string *)&local_70,pcVar5,&local_b1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmMakefile::GetSafeDefinition(mf,&local_50);
  std::__cxx11::string::string((string *)&local_b0,pcVar5,&local_b1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"gcc","");
  iVar4 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar4 == 0) {
    pcVar5 = "msvc8";
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_b0);
    if (iVar4 == 0) {
      pcVar5 = "bcc";
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar4 == 0) {
        pcVar5 = "sdcc";
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar4 == 0) {
          pcVar5 = "icc";
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_b0);
          pcVar5 = "ow";
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)&local_b0);
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare((char *)&local_b0);
              if (iVar4 == 0) {
                std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gcc");
              }
              goto LAB_00370585;
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar5);
LAB_00370585:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // figure out which language to use
  // for now care only for C and C++
  std::string compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  if (this->GlobalGenerator->GetLanguageEnabled("CXX") == false)
    {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
    }

  std::string hostSystemName = mf->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc";  // default to gcc
  if (compilerId == "MSVC")
    {
    compiler = "msvc8";
    }
  else if (compilerId == "Borland")
    {
    compiler = "bcc";
    }
  else if (compilerId == "SDCC")
    {
    compiler = "sdcc";
    }
  else if (compilerId == "Intel")
    {
    compiler = "icc";
    }
  else if (compilerId == "Watcom" || compilerId == "OpenWatcom")
    {
    compiler = "ow";
    }
  else if (compilerId == "GNU")
    {
    compiler = "gcc";
    }
  return compiler;
}